

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O0

int Maj_ManExactSynthesis(int nVars,int nNodes,int fUseConst,int fUseLine,int fVerbose)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Maj_Man_t *p_00;
  abctime aVar4;
  abctime aVar5;
  abctime clk;
  int status;
  Maj_Man_t *p;
  abctime clkTotal;
  uint local_20;
  int iMint;
  int i;
  int fVerbose_local;
  int fUseLine_local;
  int fUseConst_local;
  int nNodes_local;
  int nVars_local;
  
  clkTotal._4_4_ = 0;
  iMint = fVerbose;
  i = fUseLine;
  fVerbose_local = fUseConst;
  fUseLine_local = nNodes;
  fUseConst_local = nVars;
  aVar3 = Abc_Clock();
  p_00 = Maj_ManAlloc(fUseConst_local,fUseLine_local,fVerbose_local,i);
  iVar1 = Maj_ManAddCnfStart(p_00);
  if (iVar1 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                  ,0x174,"int Maj_ManExactSynthesis(int, int, int, int, int)");
  }
  printf("Running exact synthesis for %d-input majority with %d MAJ3 gates...\n",
         (ulong)(uint)p_00->nVars,(ulong)(uint)p_00->nNodes);
  local_20 = 0;
  do {
    if (clkTotal._4_4_ == -1) {
LAB_006fd1da:
      if (clkTotal._4_4_ == -1) {
        Maj_ManPrintSolution(p_00);
      }
      Maj_ManFree(p_00);
      aVar4 = Abc_Clock();
      Abc_PrintTime(1,"Total runtime",aVar4 - aVar3);
      return (int)(clkTotal._4_4_ == -1);
    }
    aVar4 = Abc_Clock();
    iVar1 = Maj_ManAddCnf(p_00,clkTotal._4_4_);
    if (iVar1 == 0) goto LAB_006fd1da;
    iVar1 = bmcg_sat_solver_solve(p_00->pSat,(int *)0x0,0);
    if (iMint != 0) {
      printf("Iter %3d : ",(ulong)local_20);
      Extra_PrintBinary(_stdout,(uint *)((long)&clkTotal + 4),p_00->nVars);
      printf("  Var =%5d  ",(ulong)(uint)p_00->iVar);
      uVar2 = bmcg_sat_solver_clausenum(p_00->pSat);
      printf("Cla =%6d  ",(ulong)uVar2);
      uVar2 = bmcg_sat_solver_conflictnum(p_00->pSat);
      printf("Conf =%9d  ",(ulong)uVar2);
      aVar5 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar5 - aVar4);
    }
    if (iVar1 == -1) {
      printf("The problem has no solution.\n");
      goto LAB_006fd1da;
    }
    clkTotal._4_4_ = Maj_ManEval(p_00);
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

int Maj_ManExactSynthesis( int nVars, int nNodes, int fUseConst, int fUseLine, int fVerbose )
{
    int i, iMint = 0;
    abctime clkTotal = Abc_Clock();
    Maj_Man_t * p = Maj_ManAlloc( nVars, nNodes, fUseConst, fUseLine );
    int status = Maj_ManAddCnfStart( p );
    assert( status );
    printf( "Running exact synthesis for %d-input majority with %d MAJ3 gates...\n", p->nVars, p->nNodes );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Maj_ManAddCnf( p, iMint ) )
            break;
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        if ( fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", bmcg_sat_solver_clausenum(p->pSat) );
            printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == GLUCOSE_UNSAT )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        iMint = Maj_ManEval( p );
    }
    if ( iMint == -1 )
        Maj_ManPrintSolution( p );
    Maj_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return iMint == -1;
}